

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

time_t __thiscall Time::LocalTime::asNative(LocalTime *this)

{
  time_t tim;
  time_t tVar1;
  time_t offset;
  time_t start;
  tm utcT;
  tm ekT;
  LocalTime *this_local;
  
  memset(&utcT.tm_zone,0,0x38);
  makeLocalTime((this->super_Time).timeSinceEpoch.tv_sec,(tm *)&utcT.tm_zone);
  memset(&start,0,0x38);
  tim = time((time_t *)0x0);
  makeUTCTime(tim,(tm *)&start);
  tVar1 = makeTime((tm *)&start);
  return (this->super_Time).timeSinceEpoch.tv_sec - (tVar1 - tim);
}

Assistant:

time_t LocalTime::asNative() const
    {
        struct tm ekT = {0};
        makeLocalTime(timeSinceEpoch.tv_sec, ekT);
        struct tm utcT = {0};
        time_t start = time(NULL);
        makeUTCTime(start, utcT);
        utcT.tm_isdst = ekT.tm_isdst;

        // Compute offset from GMT and localtime, including DST
        time_t offset = makeTime(&utcT) - start;
        return timeSinceEpoch.tv_sec - offset;
    }